

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cc
# Opt level: O2

string * __thiscall
onmt::int_to_hex_abi_cxx11_(string *__return_storage_ptr__,onmt *this,int i,int width)

{
  long lVar1;
  ostream *this_00;
  stringstream stream;
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  this_00 = std::operator<<(local_190,0x30);
  lVar1 = *(long *)this_00;
  *(long *)(this_00 + *(long *)(lVar1 + -0x18) + 0x10) = (long)i;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(this_00 + lVar1 + 0x18) = *(uint *)(this_00 + lVar1 + 0x18) & 0xffffffb5 | 8;
  std::ostream::operator<<(this_00,(int)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

std::string int_to_hex(int i, int width)
  {
    std::stringstream stream;
    stream << std::setfill('0') << std::setw(width) << std::hex << i;
    return stream.str();
  }